

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
FastVector<ExternConstantInfo,_false,_false>::FastVector
          (FastVector<ExternConstantInfo,_false,_false> *this,uint reserved)

{
  ExternConstantInfo *pEVar1;
  
  pEVar1 = (ExternConstantInfo *)(*(code *)NULLC::alloc)(reserved * 0xc + 4);
  this->data = pEVar1;
  if (pEVar1 != (ExternConstantInfo *)0x0) {
    this->max = reserved;
    this->count = 0;
    return;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x1c,
                "FastVector<ExternConstantInfo>::FastVector(unsigned int) [T = ExternConstantInfo, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

explicit FastVector(unsigned reserved)
	{
		if(!skipConstructor)
			data = NULLC::construct<T>(reserved);
		else
			data = (T*)NULLC::alignedAlloc(sizeof(T) * reserved);

		assert(data);

		if(zeroNewMemory)
			NULLC::fillMemory(data, 0, reserved * sizeof(T));

		max = reserved;
		count = 0;
	}